

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
RegisterBuildTestTwoOutputs::RegisterBuildTestTwoOutputs(RegisterBuildTestTwoOutputs *this)

{
  RegisterBuildTestTwoOutputs *this_local;
  
  RegisterTest(BuildTestTwoOutputs::Create,"BuildTest.TwoOutputs");
  return;
}

Assistant:

TEST_F(BuildTest, TwoOutputs) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"build out1 out2: touch in.txt\n"));

  fs_.Create("in.txt", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("touch out1 out2", command_runner_.commands_ran_[0]);
}